

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall
nigel::Lexer::splitToken
          (Lexer *this,String *identifier,size_t index,iterator *token,
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
          *lexerStruct)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *this_01;
  _Node *p_Var6;
  undefined1 local_89;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _List_node_base *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  shared_ptr<nigel::Token> local_48;
  element_type *local_38;
  
  local_38 = (element_type *)lexerStruct;
  std::__cxx11::string::substr((ulong)&local_68,(ulong)identifier);
  std::__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::Token_Operator>,std::__cxx11::string>
            ((__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<nigel::Token_Operator> *)&local_89,&local_68);
  peVar4 = local_88;
  local_48.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  local_48.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_80;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)identifier);
  std::__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::Token_Operator>,std::__cxx11::string>
            ((__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<nigel::Token_Operator> *)&local_89,&local_68);
  peVar5 = local_88;
  local_70 = (_List_node_base *)p_Stack_80;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = token->_M_node[1]._M_next;
  p_Var3 = p_Var2[2]._M_prev;
  peVar4->lineNo = (size_t)p_Var2[2]._M_next;
  peVar4->columnNo = (size_t)p_Var3;
  (peVar4->line).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)p_Var2[3]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar4->line).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  (peVar4->path).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p_Var2[4]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar4->path).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[4]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  ((_List_node_base *)((long)peVar5 + 0x20))->_M_prev =
       (_List_node_base *)((long)&(p_Var2[2]._M_prev)->_M_next + index);
  ((_List_node_base *)((long)peVar5 + 0x20))->_M_next = p_Var2[2]._M_next;
  ((_List_node_base *)((long)peVar5 + 0x30))->_M_next = p_Var2[3]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &((_List_node_base *)((long)peVar5 + 0x30))->_M_prev,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  ((_List_node_base *)((long)peVar5 + 0x40))->_M_next = p_Var2[4]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &((_List_node_base *)((long)peVar5 + 0x40))->_M_prev,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[4]._M_prev);
  Token::as<nigel::Token_Operator>((Token *)&local_68);
  std::__cxx11::string::_M_assign((string *)identifier);
  this_01 = local_38;
  if ((element_type *)local_68._M_string_length != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
  }
  p_Var6 = std::__cxx11::
           list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>>::
           _M_create_node<std::shared_ptr<nigel::Token>const&>
                     ((list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>>
                       *)this_01,&local_48);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  paVar1 = &this_01->field_2;
  paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity + 1;
  p_Var2 = token->_M_node;
  p_Var2[1]._M_next = (_List_node_base *)peVar5;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
  p_Var2[1]._M_prev = local_70;
  token->_M_node = token->_M_node->_M_prev;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_48.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void Lexer::splitToken( String &identifier, size_t index, std::list<std::shared_ptr<Token>>::iterator &token, std::list<std::shared_ptr<Token>> &lexerStruct )
	{
		std::shared_ptr<Token> tmp1 = std::make_shared<Token_Operator>( identifier.substr( 0, index ) );
		std::shared_ptr<Token> tmp2 = std::make_shared<Token_Operator>( identifier.substr( index ) );

		tmp1->columnNo = ( *token )->columnNo;
		tmp1->lineNo = ( *token )->lineNo;
		tmp1->line = ( *token )->line;
		tmp1->path = ( *token )->path;
		tmp2->columnNo = ( *token )->columnNo + index;
		tmp2->lineNo = ( *token )->lineNo;
		tmp2->line = ( *token )->line;
		tmp2->path = ( *token )->path;

		identifier = tmp1->as<Token_Operator>()->operatorToken;
		lexerStruct.insert( token, tmp1 );
		token->swap( tmp2 );
		token--;
	}